

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<10,_7,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float fVar1;
  long lVar2;
  float afStack_88 [4];
  Type in0;
  Matrix<float,_4,_2> local_54;
  MatrixCaseUtils local_34 [12];
  VecAccess<float,_4,_3> local_28;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    afStack_88[2] = 8.19275e-39;
    afStack_88[3] = 0.0;
    tcu::Matrix<float,_4,_2>::Matrix(&in0);
    in0.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    in0.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    in0.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    in0.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
  }
  else {
    afStack_88[2] = 8.192798e-39;
    afStack_88[3] = 0.0;
    tcu::Matrix<float,_4,_2>::Matrix(&in0,(float *)sr::(anonymous_namespace)::s_constInMat2x4);
  }
  afStack_88[2] = 8.192812e-39;
  afStack_88[3] = 0.0;
  tcu::Matrix<float,_4,_2>::Matrix(&local_54);
  for (lVar2 = 4; lVar2 != 8; lVar2 = lVar2 + 1) {
    fVar1 = in0.m_data.m_data[0].m_data[lVar2];
    in0.m_data.m_data[1].m_data[lVar2 + 1] = -afStack_88[lVar2];
    local_54.m_data.m_data[0].m_data[lVar2] = -fVar1;
  }
  afStack_88[2] = 8.192907e-39;
  afStack_88[3] = 0.0;
  reduceToVec3(local_34,&local_54);
  local_28.m_vector = &evalCtx->color;
  local_28.m_index[0] = 0;
  local_28.m_index[1] = 1;
  local_28.m_index[2] = 2;
  afStack_88[2] = 8.192969e-39;
  afStack_88[3] = 0.0;
  tcu::VecAccess<float,_4,_3>::operator=(&local_28,(Vector<float,_3> *)local_34);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		evalCtx.color.xyz() = reduceToVec3(negate(in0));
	}